

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O0

ifstream * ev3dev::anon_unknown_20::ifstream_open(string *path)

{
  ifstream *piVar1;
  ulong uVar2;
  undefined8 in_RDI;
  string *unaff_retaddr;
  ifstream *file;
  
  piVar1 = ifstream_cache(unaff_retaddr);
  uVar2 = std::ifstream::is_open();
  if ((uVar2 & 1) == 0) {
    std::ifstream::open(piVar1,in_RDI,8);
  }
  else {
    std::ios::clear(piVar1 + *(long *)(*(long *)piVar1 + -0x18),0);
    std::istream::seekg((long)piVar1,_S_beg);
  }
  return piVar1;
}

Assistant:

std::ifstream &ifstream_open(const std::string &path) {
    std::ifstream &file = ifstream_cache(path);
    if (!file.is_open()) {
        file.open(path);
    } else {
        // Clear the flags bits in case something happened (like reaching EOF).
        file.clear();
        file.seekg(0, std::ios::beg);
    }
    return file;
}